

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O3

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Tri::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Tri *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  pointer ppSVar2;
  undefined8 uVar3;
  SingleMthdTest *this_01;
  result_type rVar4;
  Test *pTVar5;
  MthdCtxPattern *this_02;
  MthdOperation *this_03;
  MthdVtxXy *pMVar6;
  MthdCtxSurf2D *this_04;
  vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>> *pvVar7;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_5f1;
  MthdVtxXy *local_5f0;
  MthdVtxXy *local_5e8;
  vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>> *local_5e0
  ;
  string local_5d8;
  Test *local_5b8;
  MthdCtxSurf2D *local_5b0;
  undefined1 local_5a8 [144];
  undefined1 *local_518;
  long local_510;
  undefined1 local_508 [16];
  undefined1 *local_4f8;
  long local_4f0;
  undefined1 local_4e8 [16];
  MthdVtxXy *local_4d8;
  Test *local_4d0;
  MthdVtxXy *local_4c8;
  Test *local_4c0;
  Test *local_4b8;
  MthdVtxXy *local_4b0;
  MthdOperation *local_4a8;
  MthdCtxPattern *local_4a0;
  Test *local_498;
  SingleMthdTest *local_490;
  undefined1 *local_488;
  long local_480;
  undefined1 local_478 [16];
  undefined1 *local_468;
  long local_460;
  undefined1 local_458 [16];
  undefined1 *local_448;
  long local_440;
  undefined1 local_438 [16];
  undefined1 *local_428;
  long local_420;
  undefined1 local_418 [16];
  undefined1 *local_408;
  long local_400;
  undefined1 local_3f8 [16];
  undefined1 *local_3e8;
  long local_3e0;
  undefined1 local_3d8 [16];
  undefined1 *local_3c8;
  long local_3c0;
  undefined1 local_3b8 [16];
  undefined1 *local_3a8;
  long local_3a0;
  undefined1 local_398 [16];
  undefined1 *local_388;
  long local_380;
  undefined1 local_378 [16];
  undefined1 *local_368;
  long local_360;
  undefined1 local_358 [16];
  undefined1 *local_348;
  long local_340;
  undefined1 local_338 [16];
  undefined1 *local_328;
  long local_320;
  undefined1 local_318 [16];
  undefined1 *local_308;
  long local_300;
  undefined1 local_2f8 [16];
  undefined1 *local_2e8;
  long local_2e0;
  undefined1 local_2d8 [16];
  undefined1 *local_2c8;
  long local_2c0;
  undefined1 local_2b8 [16];
  undefined1 *local_2a8;
  long local_2a0;
  undefined1 local_298 [16];
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  SingleMthdTest *local_128;
  Test *local_120;
  Test *local_118;
  Test *local_110;
  Test *local_108;
  Test *local_100;
  MthdCtxPattern *local_f8;
  Test *local_f0;
  Test *local_e8;
  Test *local_e0;
  MthdOperation *local_d8;
  MthdSolidFormat *local_d0;
  Test *local_c8;
  MthdVtxXy *local_c0;
  MthdVtxXy *local_b8;
  MthdVtxXy *local_b0;
  Test *local_a8;
  Test *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  Test *local_80;
  MthdVtxXy *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  MthdVtxXy *local_58;
  MthdVtxXy *local_50;
  MthdVtxXy *local_48;
  Test *local_40;
  MthdVtxXy *local_38;
  
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_490 = this_01;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,opt,(uint32_t)rVar4);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356770;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this_01->name,local_5d8._M_dataplus._M_p,
             local_5d8._M_dataplus._M_p + local_5d8._M_string_length);
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356aa0;
  local_128 = this_01;
  local_5a8._136_8_ = operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5b8 = (Test *)local_5a8;
  local_5e0 = (vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
               *)__return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"notify","");
  uVar3 = local_5a8._136_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._136_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x104;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 0;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_5b8,
             (long)(local_5b8->rnd)._M_x + (long)local_5b0 + -8);
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356c90;
  local_120 = (Test *)uVar3;
  local_5a8._128_8_ = operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4f8 = local_4e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"patch","");
  uVar3 = local_5a8._128_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._128_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x10c;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 0xffffffff;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_4f8,
             local_4f8 + local_4f0);
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00357830;
  local_118 = (Test *)uVar3;
  local_5a8._120_8_ = operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_518 = local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"pm_trigger","");
  uVar3 = local_5a8._120_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._120_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x140;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 0xffffffff;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_518,
             local_518 + local_510);
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00358ad0;
  local_110 = (Test *)uVar3;
  local_5a8._112_8_ = operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  uVar3 = local_5a8._112_8_;
  local_2a8 = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"dma_notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)uVar3,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x180;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 1;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_2a8,
             local_2a8 + local_2a0);
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00357928;
  local_108 = (Test *)uVar3;
  pTVar5 = (Test *)operator_new(0x25950);
  local_498 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"ctx_clip","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x184;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 2;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_2c8,local_2c8 + local_2c0);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357a20;
  local_100 = pTVar5;
  this_02 = (MthdCtxPattern *)operator_new(0x25958);
  local_4a0 = this_02;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"ctx_pattern","");
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern(this_02,opt,(uint32_t)rVar4,&local_168,3,uVar1,0x188,uVar1 != 0x1d)
  ;
  local_f8 = this_02;
  local_5a8._104_8_ = operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"ctx_rop","");
  uVar3 = local_5a8._104_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._104_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x18c;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 4;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_2e8,
             local_2e8 + local_2e0);
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00357b18;
  local_f0 = (Test *)uVar3;
  local_5a8._96_8_ = operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"ctx_beta","");
  uVar3 = local_5a8._96_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._96_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 400;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 5;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_308,
             local_308 + local_300);
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00357c10;
  local_e8 = (Test *)uVar3;
  local_5a8._88_8_ = operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_328 = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"missing","");
  uVar3 = local_5a8._88_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._88_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x200;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 0xffffffff;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_328,
             local_328 + local_320);
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00358790;
  local_e0 = (Test *)uVar3;
  this_03 = (MthdOperation *)operator_new(0x25958);
  local_4a8 = this_03;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"operation","");
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation(this_03,opt,(uint32_t)rVar4,&local_188,8,uVar1,0x2fc,uVar1 != 0x1d);
  local_d8 = this_03;
  local_5a8._80_8_ = operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"format","");
  uVar3 = local_5a8._80_8_;
  uVar1 = (this->super_Class).cls;
  MthdSolidFormat::MthdSolidFormat
            ((MthdSolidFormat *)local_5a8._80_8_,opt,(uint32_t)rVar4,&local_1a8,9,uVar1,0x300,
             uVar1 != 0x1d);
  local_d0 = (MthdSolidFormat *)uVar3;
  local_5a8._72_8_ = operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_348 = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"color","");
  uVar3 = local_5a8._72_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._72_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x304;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 10;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_348,
             local_348 + local_340);
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_0035a7d8;
  local_c8 = (Test *)uVar3;
  pMVar6 = (MthdVtxXy *)operator_new(0x25958);
  local_4b0 = pMVar6;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"triangle.0.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar6,opt,(uint32_t)rVar4,&local_1c8,0xb,(this->super_Class).cls,0x310,1,4,1);
  local_c0 = pMVar6;
  local_5a8._64_8_ = operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"triangle.1.xy","");
  uVar3 = local_5a8._64_8_;
  MthdVtxXy::MthdVtxXy
            ((MthdVtxXy *)local_5a8._64_8_,opt,(uint32_t)rVar4,&local_1e8,0xc,
             (this->super_Class).cls,0x314,1,4,0);
  local_b8 = (MthdVtxXy *)uVar3;
  local_5a8._56_8_ = operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangle.2.xy","");
  uVar3 = local_5a8._56_8_;
  MthdVtxXy::MthdVtxXy
            ((MthdVtxXy *)local_5a8._56_8_,opt,(uint32_t)rVar4,&local_208,0xd,
             (this->super_Class).cls,0x318,1,4,4);
  local_b0 = (MthdVtxXy *)uVar3;
  local_5a8._48_8_ = operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_368 = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"triangle32.0.x","");
  uVar3 = local_5a8._48_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._48_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 800;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 0xe;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_368,
             local_368 + local_360);
  local_5f0 = (MthdVtxXy *)&PTR__SingleMthdTest_00357f58;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00357f58;
  *(undefined2 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x119) = 1;
  local_a8 = (Test *)uVar3;
  pTVar5 = (Test *)operator_new(0x25958);
  local_4b8 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_388 = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"triangle32.0.y","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x324;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0xf;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_388,local_388 + local_380);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358050;
  *(undefined2 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 0;
  local_a0 = pTVar5;
  local_5a8._40_8_ = operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3a8 = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"triangle32.1.x","");
  uVar3 = local_5a8._40_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._40_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x328;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 0x10;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_3a8,
             local_3a8 + local_3a0);
  *(_func_int ***)uVar3 = (_func_int **)local_5f0;
  *(undefined2 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x119) = 0;
  local_98 = (Test *)uVar3;
  pTVar5 = (Test *)operator_new(0x25958);
  local_4c0 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3c8 = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"triangle32.1.y","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x32c;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_3c8,local_3c8 + local_3c0);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358050;
  *(undefined2 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 0;
  local_90 = pTVar5;
  local_5a8._32_8_ = operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5e8 = (MthdVtxXy *)&PTR__SingleMthdTest_00358050;
  local_3e8 = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"triangle32.2.x","");
  uVar3 = local_5a8._32_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._32_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x330;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 0x12;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_3e8,
             local_3e8 + local_3e0);
  *(_func_int ***)uVar3 = (_func_int **)local_5f0;
  *(undefined2 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x119) = 0;
  local_88 = (Test *)uVar3;
  local_5a8._24_8_ = operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_408 = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"triangle32.2.y","");
  uVar3 = local_5a8._24_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._24_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x334;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 4;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 1;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 0x13;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_408,
             local_408 + local_400);
  *(_func_int ***)uVar3 = (_func_int **)local_5e8;
  *(undefined2 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x119) = 0x100;
  local_80 = (Test *)uVar3;
  pMVar6 = (MthdVtxXy *)operator_new(0x25958);
  local_4c8 = pMVar6;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"polytri.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar6,opt,(uint32_t)rVar4,&local_228,0x14,(this->super_Class).cls,0x400,0x20,4,6);
  local_78 = pMVar6;
  local_5a8._16_8_ = operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_428 = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"polytri32.x","");
  uVar3 = local_5a8._16_8_;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_5a8._16_8_,opt,(uint32_t)rVar4);
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x106) = 0xffffffff;
  *(_func_int ***)uVar3 = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x894) = 0x480;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x113) = 8;
  *(undefined4 *)((long)(((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x89c) = 0x10;
  *(undefined4 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x114) = 0x15;
  (((Test *)(uVar3 + 0x25080))->rnd)._M_x[0x115] =
       (unsigned_long)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x115),local_428,
             local_428 + local_420);
  *(_func_int ***)uVar3 = (_func_int **)local_5f0;
  *(undefined2 *)((((Test *)(uVar3 + 0x25080))->rnd)._M_x + 0x119) = 0x100;
  local_70 = (Test *)uVar3;
  pTVar5 = (Test *)operator_new(0x25958);
  local_4d0 = pTVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_448 = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"polytri32.y","");
  pMVar6 = local_5e8;
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x484;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x16;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_448,local_448 + local_440);
  pTVar5->_vptr_Test = (_func_int **)pMVar6;
  *(undefined2 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 0x101;
  local_68 = pTVar5;
  pTVar5 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_468 = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"ctriangle.color","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x500;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 0x10;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 8;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x17;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_468,local_468 + local_460);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a7d8;
  local_60 = pTVar5;
  pMVar6 = (MthdVtxXy *)operator_new(0x25958);
  local_4d8 = pMVar6;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"ctriangle.0.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar6,opt,(uint32_t)rVar4,&local_248,0x18,(this->super_Class).cls,0x504,8,0x10,1);
  local_58 = pMVar6;
  local_5f0 = (MthdVtxXy *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"ctriangle.1.xy","");
  pMVar6 = local_5f0;
  MthdVtxXy::MthdVtxXy
            (local_5f0,opt,(uint32_t)rVar4,&local_268,0x19,(this->super_Class).cls,0x508,8,0x10,0);
  local_50 = pMVar6;
  local_5e8 = (MthdVtxXy *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"ctriangle.2.xy","");
  pMVar6 = local_5e8;
  MthdVtxXy::MthdVtxXy
            (local_5e8,opt,(uint32_t)rVar4,&local_288,0x1a,(this->super_Class).cls,0x50c,8,0x10,4);
  local_48 = pMVar6;
  pTVar5 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_488 = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"cpolytri.color","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar5,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x580;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 0x1b;
  pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_488,local_488 + local_480);
  pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a7d8;
  local_40 = pTVar5;
  pMVar6 = (MthdVtxXy *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"cpolytri.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar6,opt,(uint32_t)rVar4,&local_148,0x1c,(this->super_Class).cls,0x584,0x10,8,6);
  pvVar7 = local_5e0;
  __l._M_len = 0x1f;
  __l._M_array = &local_128;
  local_38 = pMVar6;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector((vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)local_5e0,__l,&local_5f1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if (local_488 != local_478) {
    operator_delete(local_488);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if (local_468 != local_458) {
    operator_delete(local_468);
  }
  if (local_448 != local_438) {
    operator_delete(local_448);
  }
  if (local_428 != local_418) {
    operator_delete(local_428);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if (local_408 != local_3f8) {
    operator_delete(local_408);
  }
  if (local_3e8 != local_3d8) {
    operator_delete(local_3e8);
  }
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8);
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8);
  }
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  if (local_518 != local_508) {
    operator_delete(local_518);
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8);
  }
  if (local_5b8 != (Test *)local_5a8) {
    operator_delete(local_5b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p);
  }
  ppSVar2 = *(pointer *)(pvVar7 + 8);
  if ((this->super_Class).cls == 0x1d) {
    pTVar5 = (Test *)operator_new(0x25958);
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_128 = (SingleMthdTest *)&stack0xfffffffffffffee8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"ctx_dst","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar5,opt,(uint32_t)rVar4);
    *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x194;
    *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 7;
    pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_128,
               (long)(local_128->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd.
                     _M_x + (long)(&local_120->rnd + -1) + 0x1378U);
    pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357450;
    *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x119) = 0;
    local_5d8._M_dataplus._M_p = (pointer)pTVar5;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>(local_5e0,ppSVar2,&local_5d8);
    pvVar7 = local_5e0;
    if (local_128 != (SingleMthdTest *)&stack0xfffffffffffffee8) {
      operator_delete(local_128);
      pvVar7 = local_5e0;
    }
  }
  else {
    pTVar5 = (Test *)operator_new(0x25950);
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_128 = (SingleMthdTest *)&stack0xfffffffffffffee8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"ctx_beta4","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar5,opt,(uint32_t)rVar4);
    *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar5[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x894) = 0x194;
    *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar5[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar5[0x1e].rnd._M_x + 0x114) = 6;
    pTVar5[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar5[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar5[0x1e].rnd._M_x + 0x115),local_128,
               (long)(local_128->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd.
                     _M_x + (long)(&local_120->rnd + -1) + 0x1378U);
    pTVar5->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357d08;
    local_5b8 = pTVar5;
    this_04 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"ctx_surf2d","");
    pvVar7 = local_5e0;
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_04,opt,(uint32_t)rVar4,&local_5d8,7,(this->super_Class).cls,0x198,1);
    local_5b0 = this_04;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>(pvVar7,ppSVar2,&local_5b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
      operator_delete(local_5d8._M_dataplus._M_p);
    }
    if (local_128 != (SingleMthdTest *)&stack0xfffffffffffffee8) {
      operator_delete(local_128);
    }
  }
  return (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)pvVar7;
}

Assistant:

std::vector<SingleMthdTest *> Tri::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 2, cls, 0x184),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x1d),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, cls != 0x1d),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, cls != 0x1d),
		new MthdSolidColor(opt, rnd(), "color", 10, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "triangle.0.xy", 11, cls, 0x310, 1, 4, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "triangle.1.xy", 12, cls, 0x314, 1, 4, 0),
		new MthdVtxXy(opt, rnd(), "triangle.2.xy", 13, cls, 0x318, 1, 4, VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "triangle32.0.x", 14, cls, 0x320, 1, 4, VTX_FIRST),
		new MthdVtxY32(opt, rnd(), "triangle32.0.y", 15, cls, 0x324, 1, 4, VTX_FIRST),
		new MthdVtxX32(opt, rnd(), "triangle32.1.x", 16, cls, 0x328, 1, 4, 0),
		new MthdVtxY32(opt, rnd(), "triangle32.1.y", 17, cls, 0x32c, 1, 4, 0),
		new MthdVtxX32(opt, rnd(), "triangle32.2.x", 18, cls, 0x330, 1, 4, VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "triangle32.2.y", 19, cls, 0x334, 1, 4, VTX_DRAW),
		new MthdVtxXy(opt, rnd(), "polytri.xy", 20, cls, 0x400, 0x20, 4, VTX_POLY | VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "polytri32.x", 21, cls, 0x480, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "polytri32.y", 22, cls, 0x484, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "ctriangle.color", 23, cls, 0x500, 8, 0x10),
		new MthdVtxXy(opt, rnd(), "ctriangle.0.xy", 24, cls, 0x504, 8, 0x10, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "ctriangle.1.xy", 25, cls, 0x508, 8, 0x10, 0),
		new MthdVtxXy(opt, rnd(), "ctriangle.2.xy", 26, cls, 0x50c, 8, 0x10, VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "cpolytri.color", 27, cls, 0x580, 0x10, 8),
		new MthdVtxXy(opt, rnd(), "cpolytri.xy", 28, cls, 0x584, 0x10, 8, VTX_POLY | VTX_DRAW),
	};
	if (cls == 0x1d) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, SURF2D_NV10),
		});
	}
	return res;
}